

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O2

void hexdump(void *ptr,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 0;
  while (uVar2 < len) {
    lVar3 = 0x10;
    for (; (lVar3 != 0 && (uVar2 < len)); uVar2 = uVar2 + 1) {
      pcVar1 = "";
      if (lVar3 == 0x10) {
        pcVar1 = " ";
      }
      printf("%s%02x",pcVar1,(ulong)*(byte *)((long)ptr + uVar2));
      lVar3 = lVar3 + -1;
    }
  }
  putchar(10);
  return;
}

Assistant:

static void hexdump(const void *ptr, size_t len)
{
    const unsigned char *p = ptr;
    size_t i, j;

    for (i = 0; i < len; i += j) {
	for (j = 0; j < 16 && i + j < len; j++)
	    printf("%s%02x", j? "" : " ", p[i + j]);
    }
    printf("\n");
}